

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

void __thiscall ValueType::ToString(ValueType *this,wchar (*str) [256])

{
  char cVar1;
  long lVar2;
  bool bVar3;
  char local_118 [8];
  char charStr [256];
  
  ToString(this,(char (*) [256])local_118);
  lVar2 = 0;
  do {
    cVar1 = local_118[lVar2];
    (*str)[lVar2] = (short)cVar1;
    if (cVar1 == L'\0') {
      return;
    }
    bVar3 = lVar2 != 0xff;
    lVar2 = lVar2 + 1;
  } while (bVar3);
  return;
}

Assistant:

void ValueType::ToString(wchar (&str)[VALUE_TYPE_MAX_STRING_SIZE]) const
{
    char charStr[VALUE_TYPE_MAX_STRING_SIZE];
    ToString(charStr);
    for(int i = 0; i < VALUE_TYPE_MAX_STRING_SIZE; ++i)
    {
        str[i] = charStr[i];
        if(!charStr[i])
            break;
    }
}